

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementUnsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,uint32 index,
          RegSlot regSlot)

{
  undefined1 *puVar1;
  undefined2 valueType;
  code *pcVar2;
  bool bVar3;
  ValueType VVar4;
  Instr *pIVar5;
  RegOpnd *baseReg;
  IndirOpnd *pIVar6;
  RegOpnd *pRVar7;
  JitProfilingInstr *instr;
  undefined4 *puVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  Instr *pIVar9;
  undefined6 in_register_00000032;
  OpCode opcode;
  RegOpnd **ppRVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  uint32 local_40;
  uint32 local_3c;
  RegSlot local_38;
  char local_31;
  
  local_40 = index;
  local_31 = Func::DoSimpleJitDynamicProfile(this->m_func);
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x9e:
    local_3c = offset;
    local_38 = regSlot;
    baseReg = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_4a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_48.field_0,false);
    VVar4 = ValueType::SetArrayTypeId((ValueType *)&local_4a.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&baseReg->super_Opnd,VVar4);
    puVar1 = &(baseReg->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    opcode = StElemI_A;
    if (local_31 != '\0') {
      opcode = StElemC;
    }
    break;
  case 0x9f:
    local_38 = regSlot;
    baseReg = IR::RegOpnd::New(TyVar,this->m_func);
    pRVar7 = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_44.field_0,false);
    VVar4 = ValueType::SetArrayTypeId((ValueType *)&local_46.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar7->super_Opnd,VVar4);
    puVar1 = &(pRVar7->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    pIVar5 = IR::Instr::New(LdArrHead,&baseReg->super_Opnd,&pRVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar5,offset);
    local_3c = 0xffffffff;
    goto LAB_0049882e;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1731,"(false)","Unknown ElementUnsigned1 opcode");
    if (bVar3) {
      *puVar8 = 0;
      return;
    }
LAB_00498999:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  case 0xa1:
    local_3c = offset;
    local_38 = regSlot;
    baseReg = BuildSrcOpnd(this,baseRegSlot,TyVar);
    pIVar5 = (baseReg->m_sym->field_5).m_instrDef;
    if ((pIVar5 == (Instr *)0x0) || (pRVar7 = (RegOpnd *)pIVar5->m_dst, pRVar7 == (RegOpnd *)0x0)) {
      pIVar5 = this->m_func->m_exitInstr;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      pIVar9 = (Instr *)0x0;
      do {
        do {
          do {
            pIVar5 = pIVar5->m_prev;
            if (pIVar5 == (Instr *)0x0) goto LAB_00498965;
            if ((pIVar9 != (Instr *)0x0) && (pIVar9->m_prev != pIVar5)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                                 ,0x1715,
                                 "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == tmpInstr)"
                                 ,"Modifying instr list but not using EDITING iterator!");
              if (!bVar3) goto LAB_00498999;
              *puVar8 = 0;
            }
            pIVar9 = pIVar5;
          } while (pIVar5->m_dst == (Opnd *)0x0);
          ppRVar10 = (RegOpnd **)&pIVar5->m_dst;
          bVar3 = IR::Opnd::IsEqual(pIVar5->m_dst,&baseReg->super_Opnd);
          if (bVar3) goto LAB_00498770;
        } while (pIVar5->m_opcode != StElemC);
        pIVar6 = IR::Opnd::AsIndirOpnd(&(*ppRVar10)->super_Opnd);
        bVar3 = IR::Opnd::IsEqual(&pIVar6->m_baseOpnd->super_Opnd,&baseReg->super_Opnd);
      } while (!bVar3);
      pIVar6 = IR::Opnd::AsIndirOpnd(&(*ppRVar10)->super_Opnd);
      ppRVar10 = &pIVar6->m_baseOpnd;
LAB_00498770:
      pRVar7 = *ppRVar10;
      if (pRVar7 == (RegOpnd *)0x0) {
LAB_00498965:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        Js::Throw::ReportAssert
                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                   ,0x1728,"(defOpnd)","defOpnd");
        goto LAB_00498999;
      }
    }
    valueType = (pRVar7->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&baseReg->super_Opnd,(ValueType)valueType);
    opcode = StElemC;
    break;
  case 0xa2:
    local_3c = offset;
    local_38 = regSlot;
    baseReg = BuildSrcOpnd(this,baseRegSlot,TyVar);
LAB_0049882e:
    opcode = StArrSegElemC;
  }
  pIVar6 = BuildIndirOpnd(this,baseReg,local_40);
  pRVar7 = BuildSrcOpnd(this,local_38,TyVar);
  if (local_31 == '\0') {
    if (opcode == StElemC) {
      local_42 = (baseReg->super_Opnd).m_valueType.field_0;
      bVar3 = ValueType::IsUninitialized((ValueType *)&local_42.field_0);
      if (!bVar3) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New(StElemC,&pIVar6->super_Opnd,&pRVar7->super_Opnd,this->m_func)
        ;
        this_00 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(4,this->m_func->m_alloc,0x3d6ef4);
        Js::StElemInfo::StElemInfo((StElemInfo *)&this_00->field_0);
        *this_00 = (baseReg->super_Opnd).m_valueType.field_0;
        *(anon_union_2_4_ea848c7b_for_ValueType_13 **)&instr->profileId = this_00;
        goto LAB_004988a8;
      }
    }
    instr = (JitProfilingInstr *)
            IR::Instr::New(opcode,&pIVar6->super_Opnd,&pRVar7->super_Opnd,this->m_func);
  }
  else {
    instr = IR::JitProfilingInstr::New(opcode,&pIVar6->super_Opnd,&pRVar7->super_Opnd,this->m_func);
  }
LAB_004988a8:
  AddInstr(this,&instr->super_Instr,local_3c);
  return;
}

Assistant:

void
IRBuilder::BuildElementUnsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, uint32 index, Js::RegSlot regSlot)
{
    // This is an array-style access with a constant (integer) index.
    // Embed the index in the indir opnd as a constant offset.

    IR::Instr *     instr;

    const bool simpleJit = m_func->DoSimpleJitDynamicProfile();

    IR::RegOpnd *   regOpnd;
    IR::IndirOpnd * indirOpnd;
    IR::RegOpnd * baseOpnd;
    Js::OpCode opcode;
    switch (newOpcode)
    {
    case Js::OpCode::StArrItemI_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            baseOpnd->SetValueTypeFixed();

            // In the case of simplejit, we won't know the exact type of array used until run time. Due to this,
            //    we must use the specialized version of StElemC in Lowering.
            opcode = simpleJit ? Js::OpCode::StElemC : Js::OpCode::StElemI_A;
            break;
        }

    case Js::OpCode::StArrItemC_CI4:
        {
            baseOpnd = IR::RegOpnd::New(TyVar, m_func);
            // Insert LdArrHead as the next instr and clear the offset to avoid duplication.
            IR::RegOpnd *const arrayOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            arrayOpnd->SetValueTypeFixed();

            this->AddInstr(IR::Instr::New(Js::OpCode::LdArrHead, baseOpnd, arrayOpnd, m_func), offset);
            offset = Js::Constants::NoByteCodeOffset;
            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrSegItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot, TyVar);

            // This instruction must not create missing values in the array

            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrInlineItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            IR::Opnd *defOpnd = baseOpnd->m_sym->m_instrDef ? baseOpnd->m_sym->m_instrDef->GetDst() : nullptr;
            if (!defOpnd)
            {
                // The array sym may be multi-def because of oddness in the renumbering of temps -- for instance,
                // if there's a loop increment expression whose result is unused (ExprGen only, probably).
                FOREACH_INSTR_BACKWARD(tmpInstr, m_func->m_exitInstr->m_prev)
                {
                    if (tmpInstr->GetDst())
                    {
                        if (tmpInstr->GetDst()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst();
                            break;
                        }
                        else if (tmpInstr->m_opcode == Js::OpCode::StElemC &&
                                 tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
                            break;
                        }
                    }
                }
                NEXT_INSTR_BACKWARD;
            }
            AnalysisAssert(defOpnd);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(defOpnd->GetValueType());

            opcode = Js::OpCode::StElemC;
            break;
        }
    default:
        AssertMsg(false, "Unknown ElementUnsigned1 opcode");
        return;

    }

    indirOpnd = this->BuildIndirOpnd(baseOpnd, index);
    regOpnd = this->BuildSrcOpnd(regSlot);
    if (simpleJit)
    {
        instr = IR::JitProfilingInstr::New(opcode, indirOpnd, regOpnd, m_func);
    }
    else if(opcode == Js::OpCode::StElemC && !baseOpnd->GetValueType().IsUninitialized())
    {
        // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
        // ProfiledInstr.
        IR::ProfiledInstr *const profiledInstr = IR::ProfiledInstr::New(opcode, indirOpnd, regOpnd, m_func);
        Js::StElemInfo *const stElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo);
        stElemInfo->arrayType = baseOpnd->GetValueType();
        profiledInstr->u.stElemInfo = stElemInfo;
        instr = profiledInstr;
    }
    else
    {
        instr = IR::Instr::New(opcode, indirOpnd, regOpnd, m_func);
    }

    this->AddInstr(instr, offset);
}